

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall foxxll::config::load_default_config(config *this)

{
  Logger *pLVar1;
  string local_3c0;
  string local_3a0;
  undefined1 local_380 [8];
  disk_config entry1;
  LoggerVoidify local_19d [13];
  Logger local_190;
  LoggerVoidify local_11;
  config *local_10;
  config *this_local;
  
  local_10 = this;
  tlx::Logger::Logger(&local_190);
  pLVar1 = tlx::Logger::operator<<
                     (&local_190,(char (*) [40])"foxxll: [Warning] no config file found.");
  tlx::LoggerVoidify::operator&(&local_11,pLVar1);
  tlx::Logger::~Logger(&local_190);
  tlx::Logger::Logger((Logger *)&entry1.queue_length);
  pLVar1 = tlx::Logger::operator<<
                     ((Logger *)&entry1.queue_length,
                      (char (*) [42])"foxxll: Using default disk configuration.");
  tlx::LoggerVoidify::operator&(local_19d,pLVar1);
  tlx::Logger::~Logger((Logger *)&entry1.queue_length);
  (*this->_vptr_config[6])(&local_3a0);
  (*this->_vptr_config[7])(&local_3c0);
  disk_config::disk_config((disk_config *)local_380,&local_3a0,0x3e800000,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  entry1.io_impl.field_2._M_local_buf[9] = '\x01';
  entry1.io_impl.field_2._M_local_buf[8] = '\x01';
  add_disk(this,(disk_config *)local_380);
  disk_config::~disk_config((disk_config *)local_380);
  return;
}

Assistant:

void config::load_default_config()
{
    TLX_LOG1 << "foxxll: [Warning] no config file found.";
    TLX_LOG1 << "foxxll: Using default disk configuration.";
    disk_config entry1(default_disk_path(), 1000 * 1024 * 1024,
                       default_disk_io_impl());
    entry1.delete_on_exit = true;
    entry1.autogrow = true;
    add_disk(entry1);
}